

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall CUI::ApplyCursorAlign(CUI *this,CTextCursor *pCursor,CUIRect *pRect,int Align)

{
  uint in_ECX;
  float *in_RDX;
  long in_RSI;
  float fVar1;
  float x_00;
  float y;
  float x;
  float in_stack_ffffffffffffffd8;
  
  *(uint *)(in_RSI + 0x54) = in_ECX;
  fVar1 = *in_RDX;
  if ((in_ECX & 3) == 1) {
    fVar1 = in_RDX[2] / 2.0 + fVar1;
  }
  else if ((in_ECX & 3) == 2) {
    fVar1 = in_RDX[2] + fVar1;
  }
  x_00 = in_RDX[1];
  if ((in_ECX & 0xc) == 4) {
    x_00 = in_RDX[3] / 2.0 + x_00;
  }
  else if ((in_ECX & 0xc) == 8) {
    x_00 = in_RDX[3] + x_00;
  }
  CTextCursor::MoveTo((CTextCursor *)CONCAT44(in_ECX,fVar1),x_00,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void CUI::ApplyCursorAlign(class CTextCursor *pCursor, const CUIRect *pRect, int Align)
{
	pCursor->m_Align = Align;

	float x = pRect->x;
	if((Align & TEXTALIGN_MASK_HORI) == TEXTALIGN_CENTER)
		x += pRect->w / 2.0f;
	else if((Align & TEXTALIGN_MASK_HORI) == TEXTALIGN_RIGHT)
		x += pRect->w;

	float y = pRect->y;
	if((Align & TEXTALIGN_MASK_VERT) == TEXTALIGN_MIDDLE)
		y += pRect->h / 2.0f;
	else if((Align & TEXTALIGN_MASK_VERT) == TEXTALIGN_BOTTOM)
		y += pRect->h;

	pCursor->MoveTo(x, y);
}